

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O2

unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> __thiscall
absl::lts_20240722::flags_internal::FlagImpl::MakeInitValue(FlagImpl *this)

{
  char *pcVar1;
  _Head_base<0UL,_void_*,_false> extraout_RDX;
  long in_RSI;
  void *obj;
  unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> uVar2;
  
  if ((*(byte *)(in_RSI + 0x29) & 3) == 1) {
    pcVar1 = (char *)(**(FlagOpFn *)(in_RSI + 0x18))(kAlloc,(void *)0x0,(void *)0x0,(void *)0x0);
    (**(code **)(in_RSI + 0x40))(pcVar1);
  }
  else {
    if ((*(byte *)(in_RSI + 0x29) & 3) == 0) {
      obj = *(void **)(in_RSI + 0x40);
    }
    else {
      obj = (void *)(in_RSI + 0x40);
    }
    pcVar1 = (char *)Clone(*(FlagOpFn *)(in_RSI + 0x18),obj);
  }
  DynValueDeleter::DynValueDeleter((DynValueDeleter *)this,*(FlagOpFn *)(in_RSI + 0x18));
  this->name_ = pcVar1;
  uVar2._M_t.super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
  super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  uVar2._M_t.super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
  super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
  super__Tuple_impl<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter>.
  super__Head_base<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter,_false>._M_head_impl.op
       = (_Head_base<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter,_false>)
         (_Head_base<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter,_false>)this;
  return (unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>)
         uVar2._M_t.super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>
         ._M_t.super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>;
}

Assistant:

std::unique_ptr<void, DynValueDeleter> FlagImpl::MakeInitValue() const {
  void* res = nullptr;
  switch (DefaultKind()) {
    case FlagDefaultKind::kDynamicValue:
      res = flags_internal::Clone(op_, default_value_.dynamic_value);
      break;
    case FlagDefaultKind::kGenFunc:
      res = flags_internal::Alloc(op_);
      (*default_value_.gen_func)(res);
      break;
    default:
      res = flags_internal::Clone(op_, &default_value_);
      break;
  }
  return {res, DynValueDeleter{op_}};
}